

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::FinishScopeInfo(Parser *this,ScopeInfo *scopeInfo)

{
  int blockId;
  Symbol *pSVar1;
  Symbol *sym;
  
  ThreadContext::ProbeStackNoDispose
            (this->m_scriptContext->threadContext,0x2400,this->m_scriptContext,(PVOID)0x0);
  for (; scopeInfo != (ScopeInfo *)0x0; scopeInfo = (scopeInfo->parent).ptr) {
    sym = scopeInfo->scope->m_symList;
    if (sym != (Symbol *)0x0) {
      blockId = scopeInfo->scopeId;
      do {
        pSVar1 = sym->next;
        BindPidRefsInScope(this,sym->pid,sym,blockId,0xffffffff);
        sym = pSVar1;
      } while (pSVar1 != (Symbol *)0x0);
    }
    PopScope(this,scopeInfo->scope);
    PopStmt(this,&this->m_currentBlockInfo->pstmt);
    PopBlockInfo(this);
  }
  return;
}

Assistant:

void Parser::FinishScopeInfo(Js::ScopeInfo * scopeInfo)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackByteCodeVisitor);

    for (; scopeInfo != nullptr; scopeInfo = scopeInfo->GetParentScopeInfo())
    {
        int scopeId = scopeInfo->GetScopeId();

        scopeInfo->GetScope()->ForEachSymbol([this, scopeId](Symbol *sym)
        {
            this->BindPidRefsInScope(sym->GetPid(), sym, scopeId);
        });
        PopScope(scopeInfo->GetScope());
        PopStmt(&m_currentBlockInfo->pstmt);
        PopBlockInfo();
    }
}